

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O0

_Bool allocate(int b,inform_dist **x,inform_dist **y,inform_error *err)

{
  inform_dist *piVar1;
  inform_error *err_local;
  inform_dist **y_local;
  inform_dist **x_local;
  int b_local;
  
  piVar1 = inform_dist_alloc((long)b);
  *x = piVar1;
  if (piVar1 == (inform_dist *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
    x_local._7_1_ = true;
  }
  else {
    piVar1 = inform_dist_alloc((long)b);
    *y = piVar1;
    if (piVar1 == (inform_dist *)0x0) {
      inform_dist_free(*x);
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      x_local._7_1_ = true;
    }
    else {
      x_local._7_1_ = false;
    }
  }
  return x_local._7_1_;
}

Assistant:

inline static bool allocate(int bx, int by, inform_dist **x, inform_dist **xy,
    inform_error *err)
{
    if ((*x = inform_dist_alloc(bx)) == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
    }
    if ((*xy = inform_dist_alloc(bx * by)) == NULL)
    {
        inform_dist_free(*x);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
    }
    return false;
}